

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsStaticSizedAccessImmutable(void)

{
  Span<const_int,_4UL> *pSVar1;
  ostream *poVar2;
  bool bVar3;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  Span<const_int,_4UL> local_28;
  Span<int_const,18446744073709551615ul> *this;
  
  this = (Span<int_const,18446744073709551615ul> *)&local_28;
  local_28.m_ptr = (pointer)0x200000001;
  local_28._8_8_ = 0x400000003;
  __l._M_len = 4;
  __l._M_array = (iterator)this;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_41);
  local_28.m_ptr = (pointer)0x0;
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_28.m_ptr =
         local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_28._8_8_ =
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  pSVar1 = MILBlob::Util::Span<int_const,18446744073709551615ul>::StaticResize<4ul>(&local_28,this);
  bVar3 = *(int *)&pSVar1->m_ptr != 1;
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x111);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(span.Get<0>()) == (1)",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (uint)bVar3;
}

Assistant:

int testSpanTestsStaticSizedAccessImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values).StaticResize<4>();

    ML_ASSERT_EQ(span.Get<0>(), 1);

    static_assert(std::is_same<decltype(span.Get<0>()), const int&>::value, "Get<0>() should be immutable");

    return 0;
}